

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# specwriter.cpp
# Opt level: O3

string * apngasm::spec::anon_unknown_0::createRelativeDir
                   (string *__return_storage_ptr__,string *from,string *to)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  size_type sVar3;
  int iVar4;
  uint uVar5;
  string *extraout_RAX;
  ulong uVar6;
  ulong uVar7;
  byte bVar8;
  string fromDir;
  string parentDir;
  string toDir;
  string separatorStr;
  path fromPath;
  path toPath;
  path local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  path local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  path local_80;
  path local_58;
  
  createAbsolutePath(&local_80,from);
  createAbsolutePath(&local_58,to);
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  local_a0.field_2._M_allocated_capacity._0_2_ = 0x2f;
  local_a0._M_string_length = 1;
  paVar1 = &local_110._M_pathname.field_2;
  local_110._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_110,local_80._M_pathname._M_dataplus._M_p,
             local_80._M_pathname._M_dataplus._M_p + local_80._M_pathname._M_string_length);
  cVar2 = local_110._M_pathname._M_dataplus._M_p[local_110._M_pathname._M_string_length - 1];
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_110._M_pathname._M_dataplus._M_p,
                    local_110._M_pathname.field_2._M_allocated_capacity + 1);
  }
  if (cVar2 != '/') {
    std::filesystem::__cxx11::path::_M_append
              (&local_80,local_a0._M_string_length,local_a0._M_dataplus._M_p);
  }
  local_110._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_110,local_58._M_pathname._M_dataplus._M_p,
             local_58._M_pathname._M_dataplus._M_p + local_58._M_pathname._M_string_length);
  cVar2 = local_110._M_pathname._M_dataplus._M_p[local_110._M_pathname._M_string_length - 1];
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_110._M_pathname._M_dataplus._M_p,
                    local_110._M_pathname.field_2._M_allocated_capacity + 1);
  }
  if (cVar2 != '/') {
    std::filesystem::__cxx11::path::_M_append
              (&local_58,local_a0._M_string_length,local_a0._M_dataplus._M_p);
  }
  std::filesystem::__cxx11::path::root_name();
  std::filesystem::__cxx11::path::root_name();
  iVar4 = std::filesystem::__cxx11::path::compare(&local_110);
  std::filesystem::__cxx11::path::~path(&local_c8);
  std::filesystem::__cxx11::path::~path(&local_110);
  if (iVar4 == 0) {
    local_110._M_pathname._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,local_80._M_pathname._M_dataplus._M_p,
               local_80._M_pathname._M_dataplus._M_p + local_80._M_pathname._M_string_length);
    local_c8._M_pathname._M_dataplus._M_p = (pointer)&local_c8._M_pathname.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c8,local_58._M_pathname._M_dataplus._M_p,
               local_58._M_pathname._M_dataplus._M_p + local_58._M_pathname._M_string_length);
    uVar5 = (uint)local_110._M_pathname._M_string_length;
    if (local_c8._M_pathname._M_string_length < local_110._M_pathname._M_string_length) {
      uVar5 = (uint)local_c8._M_pathname._M_string_length;
    }
    if (0 < (int)uVar5) {
      uVar6 = 0xffffffff;
      uVar7 = 0;
      do {
        iVar4 = (int)uVar6;
        if (local_110._M_pathname._M_string_length == uVar7) {
          std::__throw_out_of_range_fmt
                    ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",
                     local_110._M_pathname._M_string_length);
        }
        if (local_c8._M_pathname._M_string_length == uVar7) {
          std::__throw_out_of_range_fmt
                    ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",
                     local_c8._M_pathname._M_string_length,local_c8._M_pathname._M_string_length);
        }
        if (local_110._M_pathname._M_dataplus._M_p[uVar7] !=
            local_c8._M_pathname._M_dataplus._M_p[uVar7]) break;
        if (local_110._M_pathname._M_dataplus._M_p[uVar7] == '/') {
          uVar6 = uVar7 & 0xffffffff;
        }
        iVar4 = (int)uVar6;
        uVar7 = uVar7 + 1;
      } while ((uVar5 & 0x7fffffff) != uVar7);
      if (iVar4 != -1) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_e8,&local_110._M_pathname,(long)(iVar4 + 1),0xffffffffffffffff);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&local_110._M_pathname,&local_e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_e8,&local_c8._M_pathname,(long)(iVar4 + 1),0xffffffffffffffff);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&local_c8._M_pathname,&local_e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
      }
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    sVar3 = local_110._M_pathname._M_string_length;
    if (local_110._M_pathname._M_string_length != 0) {
      std::operator+(&local_e8,"..",&local_a0);
      if (0 < (int)(uint)sVar3) {
        bVar8 = 1;
        uVar6 = 0;
        do {
          if (local_110._M_pathname._M_string_length <= uVar6) {
            std::__throw_out_of_range_fmt
                      ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",uVar6);
          }
          if ((bool)(local_110._M_pathname._M_dataplus._M_p[uVar6] != '/' | bVar8)) {
            bVar8 = bVar8 & local_110._M_pathname._M_dataplus._M_p[uVar6] == '/';
          }
          else {
            bVar8 = 1;
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append(__return_storage_ptr__,local_e8._M_dataplus._M_p,local_e8._M_string_length);
          }
          uVar6 = uVar6 + 1;
        } while (((uint)sVar3 & 0x7fffffff) != uVar6);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (__return_storage_ptr__,local_c8._M_pathname._M_dataplus._M_p,
               local_c8._M_pathname._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_pathname._M_dataplus._M_p != &local_c8._M_pathname.field_2) {
      operator_delete(local_c8._M_pathname._M_dataplus._M_p,
                      local_c8._M_pathname.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_pathname._M_dataplus._M_p != paVar1) {
      operator_delete(local_110._M_pathname._M_dataplus._M_p,
                      local_110._M_pathname.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,local_80._M_pathname._M_dataplus._M_p,
               local_80._M_pathname._M_dataplus._M_p + local_80._M_pathname._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,
                    CONCAT62(local_a0.field_2._M_allocated_capacity._2_6_,
                             local_a0.field_2._M_allocated_capacity._0_2_) + 1);
  }
  std::filesystem::__cxx11::path::~path(&local_58);
  std::filesystem::__cxx11::path::~path(&local_80);
  return extraout_RAX;
}

Assistant:

const std::string createRelativeDir(const std::string& from, const std::string& to)
      {
        std::filesystem::path fromPath = createAbsolutePath(from);
        std::filesystem::path toPath = createAbsolutePath(to);
        const std::string separatorStr = std::string(1, separator);

        // Convert path to native.
        fromPath.make_preferred();
        toPath.make_preferred();
        if (*fromPath.string().rbegin() != separator)
          fromPath /= separatorStr;
        if (*toPath.string().rbegin() != separator)
          toPath /= separatorStr;

        // Other drive.
        if(fromPath.root_name() != toPath.root_name())
          return fromPath.string();

        // Same drive.
        std::string fromDir = fromPath.string();
        std::string toDir = toPath.string();

        {
          const int count = std::min(fromDir.length(), toDir.length());
          int find = -1;
          for (int i = 0;  i < count;  ++i) {
            const char fromChar = fromDir.at(i);
            const char toChar = toDir.at(i);

            if (fromChar == toChar) {
              if (fromChar == separator)
                find = i;
            }
            else
              break;
          } if (find != -1) {
            fromDir = fromDir.substr(find + 1);
            toDir = toDir.substr(find + 1);
          }
        }

        std::string result = "";
        if (!fromDir.empty()) {
          const int count = fromDir.length();
          const std::string parentDir = ".." + separatorStr;
          bool beforeIsSeparator = true;
          for (int i = 0;  i < count;  ++i) {
            const char currentChar = fromDir.at(i);
            if (currentChar == separator) {
              if (!beforeIsSeparator) {
                result += parentDir;
                beforeIsSeparator = true;
              }
            } else {
              beforeIsSeparator = false;
            }
          }
        }
        result += toDir;

        return result;
      }